

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O0

int clip_n_mmproj_embd(clip_ctx *ctx)

{
  mapped_type *pmVar1;
  runtime_error *this;
  undefined8 uVar2;
  long in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  string proj_type;
  string *this_00;
  string local_50 [24];
  key_type *in_stack_ffffffffffffffc8;
  map<projector_type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<projector_type>,_std::allocator<std::pair<const_projector_type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffffd0;
  int local_4;
  
  switch(*(undefined4 *)(in_RDI + 0x300)) {
  case 0:
  case 9:
    local_4 = (int)*(undefined8 *)(*(long *)(in_RDI + 0x118) + 0x10);
    break;
  case 1:
    local_4 = (int)*(undefined8 *)(*(long *)(in_RDI + 0x140) + 0x10);
    break;
  case 2:
    local_4 = (int)*(undefined8 *)(*(long *)(in_RDI + 0x1d0) + 0x10);
    break;
  case 3:
    local_4 = (int)*(undefined8 *)(*(long *)(in_RDI + 0x250) + 0x10);
    break;
  case 4:
    if (*(int *)(in_RDI + 8) == 2) {
      local_4 = 0x1000;
    }
    else if (*(int *)(in_RDI + 8) == 3) {
      local_4 = 0xe00;
    }
    else {
      if (*(int *)(in_RDI + 8) != 4) goto switchD_00161d76_default;
      local_4 = 0xe00;
    }
    break;
  case 5:
    local_4 = (int)*(undefined8 *)(*(long *)(in_RDI + 0x178) + 0x18);
    break;
  case 6:
    local_4 = (int)*(undefined8 *)(*(long *)(in_RDI + 0x130) + 0x10);
    break;
  case 7:
    local_4 = (int)*(undefined8 *)(*(long *)(in_RDI + 0x2e8) + 0x10);
    break;
  case 8:
    local_4 = (int)*(undefined8 *)(*(long *)(in_RDI + 0xf8) + 0x18);
    break;
  default:
switchD_00161d76_default:
    pmVar1 = std::
             map<projector_type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<projector_type>,_std::allocator<std::pair<const_projector_type,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    this_00 = (string *)&stack0xffffffffffffffd0;
    std::__cxx11::string::string(this_00,(string *)pmVar1);
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    uVar2 = std::__cxx11::string::c_str();
    string_format_abi_cxx11_
              ((char *)local_50,"%s: don\'t support projector with: %s currently\n",
               "clip_n_mmproj_embd",uVar2,in_R8,in_R9,this_00);
    std::runtime_error::runtime_error(this,local_50);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return local_4;
}

Assistant:

int clip_n_mmproj_embd(const struct clip_ctx * ctx) {
    switch (ctx->proj_type) {
        case PROJECTOR_TYPE_LDP:
            return ctx->vision_model.mm_model_block_1_block_2_1_b->ne[0];
        case PROJECTOR_TYPE_LDPV2:
            return ctx->vision_model.mm_model_peg_0_b->ne[0];
        case PROJECTOR_TYPE_MLP:
        case PROJECTOR_TYPE_PIXTRAL:
            return ctx->vision_model.mm_2_b->ne[0];
        case PROJECTOR_TYPE_MLP_NORM:
            return ctx->vision_model.mm_3_b->ne[0];
        case PROJECTOR_TYPE_RESAMPLER:
            if (ctx->minicpmv_version == 2) {
                return 4096;
            } else if (ctx->minicpmv_version == 3) {
                return 3584;
            } else if (ctx->minicpmv_version == 4) {
                return 3584;
            }
            break; // Should not happen if version is valid
        case PROJECTOR_TYPE_GLM_EDGE:
            return ctx->vision_model.mm_model_mlp_3_w->ne[1];
        case PROJECTOR_TYPE_MERGER:
            return ctx->vision_model.mm_1_b->ne[0];
        case PROJECTOR_TYPE_GEMMA3:
            return ctx->vision_model.mm_input_proj_w->ne[0];
        case PROJECTOR_TYPE_IDEFICS3:
            return ctx->vision_model.projection->ne[1];
        default:
            break; // Fall through to throw
    }

    std::string proj_type = PROJECTOR_TYPE_NAMES[ctx->proj_type];
    throw std::runtime_error(string_format("%s: don't support projector with: %s currently\n", __func__, proj_type.c_str()));
}